

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADE_DEP_DPFSP.cpp
# Opt level: O3

void __thiscall ADE_DEP_DPFSP::normalizza(ADE_DEP_DPFSP *this,Permutazione *p)

{
  ulong uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  undefined2 uVar5;
  ushort uVar6;
  void *pvVar7;
  undefined2 *puVar8;
  ulong uVar9;
  unsigned_short *puVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  uint uVar15;
  ushort uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  ushort uVar20;
  
  uVar2 = (this->istanza).fabbriche;
  pvVar7 = operator_new__((ulong)((uint)uVar2 * 2));
  puVar8 = (undefined2 *)operator_new__((ulong)uVar2 * 4);
  *puVar8 = 0;
  uVar20 = p->dimensione;
  puVar8[(ulong)uVar2 * 2 + -1] = uVar20 - 1;
  if (uVar20 == 0) {
    uVar13 = 0;
    uVar16 = 0xffff;
  }
  else {
    puVar10 = p->individuo;
    uVar4 = (this->istanza).lavori;
    uVar16 = 0xffff;
    uVar13 = 0;
    uVar11 = 0;
    uVar6 = 0;
    do {
      uVar3 = puVar10[uVar13];
      if (uVar3 < uVar4) {
        if (uVar3 < uVar16) {
          uVar16 = uVar3;
        }
      }
      else {
        uVar9 = (ulong)uVar6;
        uVar6 = uVar6 + 1;
        *(ushort *)((long)pvVar7 + uVar9 * 2) = uVar16;
        puVar8[uVar11 + 1 & 0xffff] = (short)uVar13 + -1;
        uVar11 = uVar11 + 2;
        puVar8[uVar11 & 0xffff] = (short)uVar13 + 1;
        uVar16 = 0xffff;
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar20);
    uVar13 = (ulong)uVar6;
  }
  *(ushort *)((long)pvVar7 + uVar13 * 2) = uVar16;
  if (1 < uVar2) {
    uVar9 = 1;
    uVar11 = 3;
    bVar14 = false;
    uVar13 = 0;
    do {
      uVar1 = uVar13 + 1;
      uVar17 = (int)uVar13 * 2 & 0xffff;
      uVar18 = (int)uVar13 * 2 + 1U & 0xffff;
      uVar12 = uVar9;
      uVar19 = uVar11;
      do {
        uVar20 = *(ushort *)((long)pvVar7 + uVar13 * 2);
        uVar4 = *(ushort *)((long)pvVar7 + uVar12 * 2);
        if (uVar4 < uVar20) {
          uVar5 = puVar8[uVar17];
          uVar15 = uVar19 - 1 & 0xffff;
          puVar8[uVar17] = puVar8[uVar15];
          puVar8[uVar15] = uVar5;
          uVar5 = puVar8[uVar18];
          puVar8[uVar18] = puVar8[(ulong)uVar19 & 0xffff];
          puVar8[(ulong)uVar19 & 0xffff] = uVar5;
          *(ushort *)((long)pvVar7 + uVar13 * 2) = uVar4;
          *(ushort *)((long)pvVar7 + uVar12 * 2) = uVar20;
          bVar14 = true;
        }
        uVar12 = uVar12 + 1;
        uVar19 = uVar19 + 2;
      } while (uVar12 < uVar2);
      uVar9 = uVar9 + 1;
      uVar11 = uVar11 + 2;
      uVar13 = uVar1;
    } while (uVar1 != uVar2 - 1);
    if (bVar14) {
      uVar4 = (this->istanza).lavori;
      puVar10 = (unsigned_short *)operator_new__((ulong)((uint)uVar2 + (uint)uVar4) * 2 - 2);
      uVar13 = 0;
      uVar20 = 0;
      do {
        uVar16 = puVar8[uVar13 * 2];
        uVar6 = (puVar8[uVar13 * 2 + 1] - uVar16) + 1;
        if (uVar6 != 0) {
          uVar9 = (ulong)uVar20;
          uVar20 = uVar20 + uVar6;
          memcpy(puVar10 + uVar9,(void *)((ulong)((uint)uVar16 + (uint)uVar16) + (long)p->individuo)
                 ,(ulong)((uint)uVar6 * 2));
        }
        if (uVar2 - 1 != uVar13) {
          uVar9 = (ulong)uVar20;
          uVar20 = uVar20 + 1;
          puVar10[uVar9] = uVar4 + (short)uVar13;
        }
        uVar13 = uVar13 + 1;
      } while (uVar2 != uVar13);
      if (p->individuo != (unsigned_short *)0x0) {
        operator_delete__(p->individuo);
      }
      p->individuo = puVar10;
    }
  }
  operator_delete__(pvVar7);
  operator_delete__(puVar8);
  return;
}

Assistant:

void ADE_DEP_DPFSP::normalizza(Permutazione* p) {
	unsigned short* valoriMinimiF = new unsigned short[istanza.fabbriche];
	unsigned short* indiciFabbriche = new unsigned short[istanza.fabbriche * 2];

	indiciFabbriche[0] = 0;
	indiciFabbriche[istanza.fabbriche * 2 - 1] = p->dimensione - 1;

	unsigned short incremento = 0;

	unsigned short valoreMinimo = UINT16_MAX;
	unsigned short f = 0;

	for (unsigned short i = 0; i < p->dimensione; i++) {
		if (p->individuo[i] >= istanza.lavori) {
			valoriMinimiF[f++] = valoreMinimo;
			valoreMinimo = UINT16_MAX;
			indiciFabbriche[++incremento] = i - 1;
			indiciFabbriche[++incremento] = i + 1;
		}
		else {
			valoreMinimo = min(valoreMinimo, p->individuo[i]);
		}
	}
	valoriMinimiF[f] = valoreMinimo;

	bool cambiamento = false;
	for (unsigned short i = 0; i < istanza.fabbriche - 1; i++) {
		for (unsigned short j = i + 1; j < istanza.fabbriche; j++) {
			if (valoriMinimiF[i] > valoriMinimiF[j]) {

				cambiamento = true;

				unsigned short ind1 = 2 * i;
				unsigned short ind2 = 2 * j;

				//scambia indici fabbriche
				unsigned short tmp = indiciFabbriche[ind1];
				indiciFabbriche[ind1] = indiciFabbriche[ind2];
				indiciFabbriche[ind2] = tmp;

				ind1++, ind2++;
				tmp = indiciFabbriche[ind1];
				indiciFabbriche[ind1] = indiciFabbriche[ind2];
				indiciFabbriche[ind2] = tmp;

				//scambia indici minimi
				tmp = valoriMinimiF[i];
				valoriMinimiF[i] = valoriMinimiF[j];
				valoriMinimiF[j] = tmp;
			}
		}
	}

	if (cambiamento) {
		unsigned short* nuovoIndividuo = new unsigned short[istanza.lavori + istanza.fabbriche - 1];

		unsigned short posizione = 0;

		for (unsigned short i = 0; i < istanza.fabbriche; i++) {

			unsigned short dimensioneFabbrica = indiciFabbriche[2 * i + 1] - indiciFabbriche[2 * i] + 1;
			if (dimensioneFabbrica > 0) {
				memcpy(&nuovoIndividuo[posizione], &p->individuo[indiciFabbriche[2 * i]], 
					dimensioneFabbrica * sizeof(unsigned short));

				posizione += dimensioneFabbrica;
			}

			if(i!=istanza.fabbriche - 1)
				nuovoIndividuo[posizione++] = istanza.lavori + i;
		}

		delete[] p->individuo;
		p->individuo = nuovoIndividuo;
	}

	delete[] valoriMinimiF;
	delete[] indiciFabbriche;
}